

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpClientAdapter::DelayedEofInputStream::pumpTo
          (DelayedEofInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  AsyncInputStream *pAVar1;
  undefined8 in_RCX;
  PromiseNode *extraout_RDX;
  Promise<unsigned_long> PVar2;
  AsyncOutputStream *local_48;
  undefined8 local_40;
  Type local_38;
  undefined8 local_28;
  uint64_t amount_local;
  AsyncOutputStream *output_local;
  DelayedEofInputStream *this_local;
  
  local_28 = in_RCX;
  amount_local = amount;
  output_local = output;
  this_local = this;
  pAVar1 = Own<kj::AsyncInputStream>::operator->((Own<kj::AsyncInputStream> *)(output + 1));
  (*pAVar1->_vptr_AsyncInputStream[3])(&local_38,pAVar1,amount_local,local_28);
  local_40 = local_28;
  local_48 = output;
  Promise<unsigned_long>::
  then<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda(unsigned_long)_1_,kj::_::PropagateException>
            ((Promise<unsigned_long> *)this,&local_38,(PropagateException *)&local_48);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_38);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<uint64_t> pumpTo(kj::AsyncOutputStream& output, uint64_t amount) override {
      return inner->pumpTo(output, amount)
          .then([this,amount](uint64_t actual) -> kj::Promise<uint64_t> {
        if (actual < amount) {
          // Must have reached EOF.
          KJ_IF_MAYBE(t, completionTask) {
            // Delay until completion.
            auto result = t->then([amount]() { return amount; });
            completionTask = nullptr;
            return result;
          } else {
            // Must have called tryRead() again after we already signaled EOF. Fine.
            return amount;
          }
        } else {
          return amount;
        }
      });
    }